

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

QString * __thiscall QMimeBinaryProvider::genericIcon(QMimeBinaryProvider *this,QString *name)

{
  long lVar1;
  CacheFile *in_RDX;
  QMimeBinaryProvider *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArray inputMime;
  QString *in_stack_ffffffffffffff68;
  QString *this_00;
  QLatin1StringView in_stack_ffffffffffffffa0;
  QByteArray *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  int posListOffset;
  QMimeBinaryProvider *this_01;
  
  posListOffset = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  this_01 = in_RSI;
  QString::toLatin1(in_stack_ffffffffffffff68);
  std::
  unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>::
  get((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
       *)this_00);
  iconForMime(this_01,in_RDX,posListOffset,in_stack_ffffffffffffffb0);
  QString::QString((QString *)in_RSI,in_stack_ffffffffffffffa0);
  QByteArray::~QByteArray((QByteArray *)0x8fcd19);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QMimeBinaryProvider::genericIcon(const QString &name)
{
    const QByteArray inputMime = name.toLatin1();
    return iconForMime(m_cacheFile.get(), PosGenericIconsListOffset, inputMime);
}